

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeDepthCompare
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,TestFunc depthFunc,ConstPixelBufferAccess *depthBuffer)

{
  PixelBufferAccess *pPVar1;
  ConstPixelBufferAccess *pCVar2;
  float fVar3;
  ChannelType CVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  bool *pbVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  deUint32 buffer [2];
  PixelBufferAccess access;
  undefined1 local_70 [8];
  undefined1 local_68 [56];
  
  CVar4 = (depthBuffer->m_format).type;
  if ((CVar4 == FLOAT_UNSIGNED_INT_24_8_REV) || (CVar4 == FLOAT)) {
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,(int)((long)uVar5 % (long)numSamplesPerFragment),
                     inputFragments[iVar8].pixelCoord.m_data[0],
                     inputFragments[iVar8].pixelCoord.m_data[1]);
          *pbVar10 = false;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_ALWAYS:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,(int)((long)uVar5 % (long)numSamplesPerFragment),
                     inputFragments[iVar8].pixelCoord.m_data[0],
                     inputFragments[iVar8].pixelCoord.m_data[1]);
          *pbVar10 = true;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_LESS:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13) < fVar12;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_LEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13) <= fVar12;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_GREATER:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = fVar12 < (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13);
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_GEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = fVar12 <= (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13);
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_EQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13) == fVar12;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_NOTEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar8 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          fVar12 = tcu::ConstPixelBufferAccess::getPixDepth
                             (depthBuffer,(int)uVar6,inputFragments[iVar8].pixelCoord.m_data[0],
                              inputFragments[iVar8].pixelCoord.m_data[1]);
          fVar3 = inputFragments[iVar8].sampleDepths[uVar6 & 0xffffffff];
          fVar13 = 1.0;
          if (fVar3 <= 1.0) {
            fVar13 = fVar3;
          }
          *pbVar10 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar13) != fVar12;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
    }
  }
  else {
    iVar8 = (int)depthBuffer;
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)(local_68 + 0x10),iVar8,(int)uVar6,
                     inputFragments[iVar9].pixelCoord.m_data[0]);
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          pPVar1 = (PixelBufferAccess *)(local_68 + 0x10);
          tcu::PixelBufferAccess::PixelBufferAccess(pPVar1,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth(pPVar1,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pPVar1,0,0);
          *pbVar10 = false;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_ALWAYS:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)(local_68 + 0x10),iVar8,(int)uVar6,
                     inputFragments[iVar9].pixelCoord.m_data[0]);
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          pPVar1 = (PixelBufferAccess *)(local_68 + 0x10);
          tcu::PixelBufferAccess::PixelBufferAccess(pPVar1,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth(pPVar1,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pPVar1,0,0);
          *pbVar10 = true;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_LESS:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = (uint)local_68._0_4_ < (uint)uVar7;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_LEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = (uint)local_68._0_4_ <= (uint)uVar7;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_GREATER:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = (uint)uVar7 < (uint)local_68._0_4_;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_GEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = (uint)uVar7 <= (uint)local_68._0_4_;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_EQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = local_68._0_4_ == uVar7;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
      break;
    case TESTFUNC_NOTEQUAL:
      pbVar10 = &this->m_sampleRegister[0].depthPassed;
      uVar11 = 0;
      do {
        if (((SampleData *)(pbVar10 + -2))->isAlive == true) {
          uVar5 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
          uVar6 = (long)uVar5 % (long)numSamplesPerFragment;
          iVar9 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
          pCVar2 = (ConstPixelBufferAccess *)(local_68 + 0x10);
          tcu::ConstPixelBufferAccess::getPixelInt
                    (pCVar2,iVar8,(int)uVar6,inputFragments[iVar9].pixelCoord.m_data[0]);
          uVar7 = local_68._16_4_;
          fVar3 = inputFragments[iVar9].sampleDepths[uVar6 & 0xffffffff];
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar2,&depthBuffer->m_format,1,1,1,local_70);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)pCVar2,fVar3,0,0,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_68,(int)pCVar2,0,0);
          *pbVar10 = local_68._0_4_ != uVar7;
        }
        uVar11 = uVar11 + 1;
        pbVar10 = pbVar10 + 0x84;
      } while (uVar11 != 0x40);
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeDepthCompare (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, TestFunc depthFunc, const tcu::ConstPixelBufferAccess& depthBuffer)
{
#define SAMPLE_REGISTER_DEPTH_COMPARE_F(COMPARE_EXPRESSION)																						\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			float				depthBufferValue	= depthBuffer.getPixDepth(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());			\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
			float				sampleDepth			= de::clamp(sampleDepthFloat, 0.0f, 1.0f);													\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}																																		\
	}

#define SAMPLE_REGISTER_DEPTH_COMPARE_UI(COMPARE_EXPRESSION)																					\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			deUint32			depthBufferValue	= depthBuffer.getPixelUint(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y()).x();	\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
																																				\
			/* Convert input float to target buffer format for comparison */																	\
																																				\
			deUint32 buffer[2];																													\
																																				\
			DE_ASSERT(sizeof(buffer) >= (size_t)depthBuffer.getFormat().getPixelSize());														\
																																				\
			tcu::PixelBufferAccess access(depthBuffer.getFormat(), 1, 1, 1, &buffer);															\
			access.setPixDepth(sampleDepthFloat, 0, 0, 0);																						\
			deUint32 sampleDepth = access.getPixelUint(0, 0, 0).x();																			\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}